

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 absl::operator+(uint128 lhs,uint128 rhs)

{
  undefined1 v [16];
  unsigned___int128 *puVar1;
  undefined8 extraout_RDX;
  uint128 *in_RSI;
  undefined8 uVar2;
  unsigned___int128 local_38;
  unsigned___int128 local_28;
  uint128 local_18;
  
  puVar1 = uint128::operator_cast_to_unsigned___int128(&local_28,in_RSI);
  uVar2 = extraout_RDX;
  uint128::operator_cast_to_unsigned___int128(&local_38,in_RSI);
  v._8_8_ = uVar2;
  v._0_8_ = puVar1;
  uint128::uint128(&local_18,(unsigned___int128)v);
  return local_18;
}

Assistant:

constexpr uint128 operator+(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return static_cast<unsigned __int128>(lhs) +
         static_cast<unsigned __int128>(rhs);
#else
  return int128_internal::AddResult(
      MakeUint128(Uint128High64(lhs) + Uint128High64(rhs),
                  Uint128Low64(lhs) + Uint128Low64(rhs)),
      lhs);
#endif
}